

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmMan.c
# Opt level: O0

void Mpm_ManPrintStatsInit(Mpm_Man_t *p)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  Mpm_Man_t *p_local;
  
  uVar1 = p->nLutSize;
  uVar2 = p->nNumCuts;
  uVar3 = Mig_ManCandNum(p->pMig);
  uVar4 = Mig_ManXorNum(p->pMig);
  uVar5 = Mig_ManMuxNum(p->pMig);
  printf("K = %d.  C = %d.  Cand = %d. XOR = %d. MUX = %d. Choice = %d.  CutMin = %d. Truth = %d. DSD = %d.\n"
         ,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,(ulong)uVar5,p->pMig->nChoices,
         p->pPars->fCutMin,p->pPars->fUseTruth,p->pPars->fUseDsd);
  return;
}

Assistant:

void Mpm_ManPrintStatsInit( Mpm_Man_t * p )
{
    printf( "K = %d.  C = %d.  Cand = %d. XOR = %d. MUX = %d. Choice = %d.  CutMin = %d. Truth = %d. DSD = %d.\n", 
        p->nLutSize, p->nNumCuts, Mig_ManCandNum(p->pMig), 
        Mig_ManXorNum(p->pMig), Mig_ManMuxNum(p->pMig), p->pMig->nChoices, 
        p->pPars->fCutMin, p->pPars->fUseTruth, p->pPars->fUseDsd );
}